

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t unaff_RBP;
  int iVar11;
  
  if (output->size < output->pos) {
    return 0xffffffffffffffba;
  }
  uVar1 = input->size;
  uVar2 = input->pos;
  if (uVar1 < uVar2) {
    return 0xffffffffffffffb8;
  }
  if (ZSTD_e_end < endOp) {
    return 0xffffffffffffffd6;
  }
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x68fc,
                  "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if (cctx->streamStage == zcss_init) {
    sVar10 = (uVar1 - uVar2) + cctx->stableIn_notConsumed;
    if (((endOp == ZSTD_e_continue) && ((cctx->requestedParams).inBufferMode == ZSTD_bm_stable)) &&
       (sVar10 < 0x20000)) {
      if ((cctx->stableIn_notConsumed == 0) ||
         ((unaff_RBP = 0xffffffffffffffce, input->src == (cctx->expectedInBuffer).src &&
          (uVar2 == (cctx->expectedInBuffer).size)))) {
        input->pos = uVar1;
        (cctx->expectedInBuffer).pos = uVar1;
        sVar3 = input->size;
        (cctx->expectedInBuffer).src = input->src;
        (cctx->expectedInBuffer).size = sVar3;
        cctx->stableIn_notConsumed = sVar10;
        unaff_RBP = (ulong)((cctx->requestedParams).format == ZSTD_f_zstd1) * 4 + 2;
      }
      bVar7 = false;
    }
    else {
      unaff_RBP = ZSTD_CCtx_init_compressStream2(cctx,endOp,sVar10);
      if (unaff_RBP < 0xffffffffffffff89) {
        if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
          (cctx->expectedInBuffer).pos = input->pos;
          sVar10 = input->size;
          (cctx->expectedInBuffer).src = input->src;
          (cctx->expectedInBuffer).size = sVar10;
        }
        bVar7 = true;
        if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
          cctx->expectedOutBufferSize = output->size - output->pos;
        }
      }
      else {
        bVar7 = false;
      }
    }
    if (!bVar7) {
      return unaff_RBP;
    }
  }
  if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
    sVar10 = 0xffffffffffffffce;
    bVar7 = true;
    if (((cctx->expectedInBuffer).src != input->src) || ((cctx->expectedInBuffer).pos != input->pos)
       ) goto LAB_0016f9c0;
  }
  if (((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) &&
     (cctx->expectedOutBufferSize != output->size - output->pos)) {
    sVar10 = 0xffffffffffffffce;
    bVar7 = true;
  }
  else {
    bVar7 = false;
    sVar10 = 0;
  }
LAB_0016f9c0:
  if (!bVar7) {
    if ((cctx->appliedParams).nbWorkers < 1) {
      sVar10 = ZSTD_compressStream_generic(cctx,output,input,endOp);
      if (sVar10 < 0xffffffffffffff89) {
        if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
          (cctx->expectedInBuffer).pos = input->pos;
          sVar10 = input->size;
          (cctx->expectedInBuffer).src = input->src;
          (cctx->expectedInBuffer).size = sVar10;
        }
        if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
          cctx->expectedOutBufferSize = output->size - output->pos;
        }
        sVar10 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
      }
    }
    else {
      if (cctx->cParamsChanged != 0) {
        ZSTDMT_updateCParams_whileCompressing(cctx->mtctx,&cctx->requestedParams);
        cctx->cParamsChanged = 0;
      }
      uVar1 = cctx->stableIn_notConsumed;
      sVar10 = unaff_RBP;
      if (uVar1 != 0) {
        if ((cctx->appliedParams).inBufferMode != ZSTD_bm_stable) {
          __assert_fail("cctx->appliedParams.inBufferMode == ZSTD_bm_stable",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x6922,
                        "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        if (input->pos < uVar1) {
          __assert_fail("input->pos >= cctx->stableIn_notConsumed",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x6924,
                        "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        input->pos = input->pos - uVar1;
        cctx->stableIn_notConsumed = 0;
      }
      do {
        sVar3 = input->pos;
        sVar4 = output->pos;
        sVar9 = ZSTDMT_compressStream_generic(cctx->mtctx,output,input,endOp);
        sVar5 = input->pos;
        cctx->consumedSrcSize = cctx->consumedSrcSize + (sVar5 - sVar3);
        sVar6 = output->pos;
        cctx->producedCSize = cctx->producedCSize + (sVar6 - sVar4);
        if ((0xffffffffffffff88 < sVar9) || (endOp == ZSTD_e_end && sVar9 == 0)) {
          cctx->streamStage = zcss_init;
          cctx->pledgedSrcSizePlusOne = 0;
        }
        iVar11 = 1;
        sVar8 = sVar9;
        if (sVar9 < 0xffffffffffffff89) {
          sVar8 = sVar10;
          if (endOp == ZSTD_e_continue) {
            iVar11 = 6;
            if ((sVar4 == sVar6 && sVar3 == sVar5) && (sVar5 != input->size)) goto LAB_0016fa49;
          }
          else {
            iVar11 = 6;
            if (sVar9 != 0) {
LAB_0016fa49:
              iVar11 = 6;
              if (sVar6 != output->size) {
                iVar11 = 0;
              }
            }
          }
        }
        sVar10 = sVar8;
      } while (iVar11 == 0);
      if (iVar11 == 6) {
        if ((sVar9 != 0 && endOp != ZSTD_e_continue) && (sVar6 != output->size)) {
          __assert_fail("endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x694a,
                        "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        if ((cctx->appliedParams).inBufferMode == ZSTD_bm_stable) {
          (cctx->expectedInBuffer).pos = input->pos;
          sVar10 = input->size;
          (cctx->expectedInBuffer).src = input->src;
          (cctx->expectedInBuffer).size = sVar10;
        }
        sVar10 = sVar9;
        if ((cctx->appliedParams).outBufferMode == ZSTD_bm_stable) {
          cctx->expectedOutBufferSize = output->size - output->pos;
        }
      }
    }
  }
  return sVar10;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        size_t const inputSize = input->size - input->pos;  /* no obligation to start from pos==0 */
        size_t const totalInputSize = inputSize + cctx->stableIn_notConsumed;
        if ( (cctx->requestedParams.inBufferMode == ZSTD_bm_stable) /* input is presumed stable, across invocations */
          && (endOp == ZSTD_e_continue)                             /* no flush requested, more input to come */
          && (totalInputSize < ZSTD_BLOCKSIZE_MAX) ) {              /* not even reached one block yet */
            if (cctx->stableIn_notConsumed) {  /* not the first time */
                /* check stable source guarantees */
                RETURN_ERROR_IF(input->src != cctx->expectedInBuffer.src, stabilityCondition_notRespected, "stableInBuffer condition not respected: wrong src pointer");
                RETURN_ERROR_IF(input->pos != cctx->expectedInBuffer.size, stabilityCondition_notRespected, "stableInBuffer condition not respected: externally modified pos");
            }
            /* pretend input was consumed, to give a sense forward progress */
            input->pos = input->size;
            /* save stable inBuffer, for later control, and flush/end */
            cctx->expectedInBuffer = *input;
            /* but actually input wasn't consumed, so keep track of position from where compression shall resume */
            cctx->stableIn_notConsumed += inputSize;
            /* don't initialize yet, wait for the first block of flush() order, for better parameters adaptation */
            return ZSTD_FRAMEHEADERSIZE_MIN(cctx->requestedParams.format);  /* at least some header to produce */
        }
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, totalInputSize), "compressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);   /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        if (cctx->stableIn_notConsumed) {
            assert(cctx->appliedParams.inBufferMode == ZSTD_bm_stable);
            /* some early data was skipped - make it available for consumption */
            assert(input->pos >= cctx->stableIn_notConsumed);
            input->pos -= cctx->stableIn_notConsumed;
            cctx->stableIn_notConsumed = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif /* ZSTD_MULTITHREAD */
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}